

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRBuilder *this_00;
  long *plVar1;
  int extraout_EAX;
  BasicBlock *bb;
  BasicBlock *target;
  BasicBlock *falseBlock;
  undefined4 in_register_00000034;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"while.body",&local_51);
  this_00 = &this->super_IRBuilder;
  bb = IRBuilder::createBlock(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"while.cond",&local_51);
  target = IRBuilder::createBlock(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"while.done",&local_51);
  falseBlock = IRBuilder::createBlock(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,bb);
  codegen(this,*(Stmt **)(CONCAT44(in_register_00000034,__fd) + 0x48));
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,target);
  plVar1 = *(long **)(CONCAT44(in_register_00000034,__fd) + 0x40);
  (**(code **)(*plVar1 + 0x10))(plVar1,this);
  IRBuilder::createCondBr(this_00,this->result_,bb,falseBlock);
  IRBuilder::setInsertPoint(this_00,falseBlock);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(WhileStmt& whileStmt) {
  BasicBlock* bodyBlock = createBlock("while.body");
  BasicBlock* condBlock = createBlock("while.cond");
  BasicBlock* doneBlock = createBlock("while.done");

  createBr(condBlock);

  setInsertPoint(bodyBlock);
  codegen(whileStmt.bodyStmt());
  createBr(condBlock);

  setInsertPoint(condBlock);
  Value* cond = codegen(whileStmt.condition());
  createCondBr(cond, bodyBlock, doneBlock);

  setInsertPoint(doneBlock);
}